

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_source_element(JSParseState *s)

{
  BOOL BVar1;
  int iVar2;
  JSParseState *in_RDI;
  JSParseState *unaff_retaddr;
  int tok;
  JSFunctionDef *fd;
  JSParseState *in_stack_00000028;
  int in_stack_000001a4;
  JSParseState *in_stack_000001a8;
  BOOL in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  JSFunctionDef *ptr;
  JSFunctionKindEnum in_stack_fffffffffffffff8;
  JSParseFunctionEnum in_stack_fffffffffffffffc;
  
  ptr = in_RDI->cur_func;
  if (((in_RDI->token).val == -0x3b) ||
     ((BVar1 = token_is_pseudo_keyword(in_RDI,0x85), BVar1 != 0 &&
      (iVar2 = peek_token((JSParseState *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc), iVar2 == -0x3b)))) {
    iVar2 = js_parse_function_decl
                      (unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,
                       (JSAtom)((ulong)in_RDI >> 0x20),(uint8_t *)ptr,in_stack_ffffffffffffffe4);
    if (iVar2 != 0) {
      return -1;
    }
  }
  else if (((in_RDI->token).val == -0x35) && (ptr->module != (JSModuleDef *)0x0)) {
    iVar2 = js_parse_export(in_stack_00000028);
    if (iVar2 != 0) {
      return -1;
    }
  }
  else if (((in_RDI->token).val == -0x33) &&
          (((ptr->module != (JSModuleDef *)0x0 &&
            (iVar2 = peek_token((JSParseState *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc), iVar2 != 0x28)) && (iVar2 != 0x2e)))) {
    iVar2 = js_parse_import((JSParseState *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (iVar2 != 0) {
      return -1;
    }
  }
  else {
    iVar2 = js_parse_statement_or_decl(in_stack_000001a8,in_stack_000001a4);
    if (iVar2 != 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

static __exception int js_parse_source_element(JSParseState *s)
{
    JSFunctionDef *fd = s->cur_func;
    int tok;
    
    if (s->token.val == TOK_FUNCTION ||
        (token_is_pseudo_keyword(s, JS_ATOM_async) &&
         peek_token(s, TRUE) == TOK_FUNCTION)) {
        if (js_parse_function_decl(s, JS_PARSE_FUNC_STATEMENT,
                                   JS_FUNC_NORMAL, JS_ATOM_NULL,
                                   s->token.ptr, s->token.line_num))
            return -1;
    } else if (s->token.val == TOK_EXPORT && fd->module) {
        if (js_parse_export(s))
            return -1;
    } else if (s->token.val == TOK_IMPORT && fd->module &&
               ((tok = peek_token(s, FALSE)) != '(' && tok != '.'))  {
        /* the peek_token is needed to avoid confusion with ImportCall
           (dynamic import) or import.meta */
        if (js_parse_import(s))
            return -1;
    } else {
        if (js_parse_statement_or_decl(s, DECL_MASK_ALL))
            return -1;
    }
    return 0;
}